

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O2

int get_cert_by_subject(X509_LOOKUP *xl,int type,X509_NAME *name,X509_OBJECT *ret)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  X509_NAME **ppXVar4;
  ulong uVar5;
  size_t sVar6;
  CRYPTO_MUTEX *lock;
  void *pvVar7;
  uint *p;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  char *b;
  size_t idx;
  void *local_1b0;
  BY_DIR_HASH htmp;
  int *local_198;
  uint32_t hash_array [2];
  X509_OBJECT stmp;
  anon_union_304_2_131d70c8 data;
  
  b = (char *)0x0;
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  puVar2 = (undefined8 *)xl->method_data;
  stmp.type = type;
  if (type == 1) {
    data.x509.st_x509.cert_info = (X509_CINF *)((long)&data + 200);
    ppXVar4 = &data.x509.st_x509_cinf.subject;
    pcVar11 = "";
  }
  else {
    if (type != 2) {
      iVar3 = 0;
      ERR_put_error(0xb,0,0x85,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                    ,0xe8);
      goto LAB_001ff3fa;
    }
    ppXVar4 = (X509_NAME **)data.x509.st_x509.cert_hash;
    data.x509.st_x509.cert_info = (X509_CINF *)((long)&data + 0x58);
    pcVar11 = "r";
  }
  stmp.data.ptr = (char *)&data;
  *ppXVar4 = name;
  uVar5 = X509_NAME_hash((X509_NAME *)name);
  hash_array[0] = (uint32_t)uVar5;
  uVar5 = X509_NAME_hash_old((X509_NAME *)name);
  hash_array[1] = (uint32_t)uVar5;
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    uVar1 = hash_array[lVar8];
    uVar5 = 0;
LAB_001ff192:
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar2);
    if (uVar5 < sVar6) {
      lock = (CRYPTO_MUTEX *)OPENSSL_sk_value((OPENSSL_STACK *)*puVar2,uVar5);
      if ((type == 2) && (*(long *)((long)lock + 0x48) != 0)) {
        htmp.hash = uVar1;
        CRYPTO_MUTEX_lock_read(lock);
        iVar3 = sk_BY_DIR_HASH_find(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),&idx,&htmp);
        if (iVar3 == 0) {
          uVar10 = 0;
          local_1b0 = (void *)0x0;
        }
        else {
          local_1b0 = OPENSSL_sk_value(*(OPENSSL_STACK **)((long)lock + 0x48),idx);
          uVar10 = (ulong)*(uint *)((long)local_1b0 + 4);
        }
        CRYPTO_MUTEX_unlock_read(lock);
      }
      else {
        uVar10 = 0;
        local_1b0 = (void *)0x0;
      }
      do {
        OPENSSL_free(b);
        uVar9 = (uint)uVar10;
        iVar3 = OPENSSL_asprintf(&b,"%s/%08x.%s%d",lock[1].__align,(ulong)uVar1,pcVar11,uVar10);
        if (iVar3 == -1) {
          iVar3 = 0;
          ERR_put_error(0xb,0,7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                        ,0x108);
          b = (char *)0x0;
          goto LAB_001ff3fa;
        }
        if (type == 1) {
          iVar3 = X509_load_cert_file((X509_LOOKUP *)xl,b,*(int *)((long)lock + 0x40));
LAB_001ff284:
          if (iVar3 == 0) goto LAB_001ff28c;
        }
        else if (type == 2) {
          iVar3 = X509_load_crl_file((X509_LOOKUP *)xl,b,*(int *)((long)lock + 0x40));
          goto LAB_001ff284;
        }
        uVar10 = (ulong)(uVar9 + 1);
      } while( true );
    }
  }
LAB_001ff44d:
  iVar3 = 0;
LAB_001ff3fa:
  OPENSSL_free(b);
  return iVar3;
LAB_001ff28c:
  ERR_clear_error();
  CRYPTO_MUTEX_lock_write(&xl->store_ctx->objs_lock);
  sk_X509_OBJECT_sort(xl->store_ctx->objs);
  iVar3 = sk_X509_OBJECT_find(xl->store_ctx->objs,&idx,&stmp);
  if (iVar3 == 0) {
    local_198 = (int *)0x0;
  }
  else {
    local_198 = (int *)OPENSSL_sk_value((OPENSSL_STACK *)xl->store_ctx->objs,idx);
  }
  CRYPTO_MUTEX_unlock_write(&xl->store_ctx->objs_lock);
  if (type != 2) goto LAB_001ff38f;
  CRYPTO_MUTEX_lock_write(lock);
  pvVar7 = local_1b0;
  if (local_1b0 == (void *)0x0) {
    htmp.hash = uVar1;
    sk_BY_DIR_HASH_sort(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48));
    iVar3 = sk_BY_DIR_HASH_find(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48),&idx,&htmp);
    if ((iVar3 != 0) &&
       (pvVar7 = OPENSSL_sk_value(*(OPENSSL_STACK **)((long)lock + 0x48),idx), pvVar7 != (void *)0x0
       )) goto LAB_001ff30d;
    p = (uint *)OPENSSL_malloc(8);
    if (p == (uint *)0x0) {
      CRYPTO_MUTEX_unlock_write(lock);
      goto LAB_001ff44d;
    }
    *p = uVar1;
    p[1] = uVar9;
    sVar6 = OPENSSL_sk_push(*(OPENSSL_STACK **)((long)lock + 0x48),p);
    if (sVar6 == 0) {
      CRYPTO_MUTEX_unlock_write(lock);
      OPENSSL_free(p);
      goto LAB_001ff44d;
    }
    sk_BY_DIR_HASH_sort(*(stack_st_BY_DIR_HASH **)((long)lock + 0x48));
  }
  else {
LAB_001ff30d:
    if (*(int *)((long)pvVar7 + 4) < (int)uVar9) {
      *(uint *)((long)pvVar7 + 4) = uVar9;
    }
  }
  CRYPTO_MUTEX_unlock_write(lock);
LAB_001ff38f:
  if (local_198 != (int *)0x0) {
    ret->type = *local_198;
    ret->data = *(anon_union_8_4_ca12f507_for_data *)(local_198 + 2);
    ERR_clear_error();
    iVar3 = 1;
    goto LAB_001ff3fa;
  }
  uVar5 = uVar5 + 1;
  goto LAB_001ff192;
}

Assistant:

static int get_cert_by_subject(X509_LOOKUP *xl, int type, X509_NAME *name,
                               X509_OBJECT *ret) {
  union {
    struct {
      X509 st_x509;
      X509_CINF st_x509_cinf;
    } x509;
    struct {
      X509_CRL st_crl;
      X509_CRL_INFO st_crl_info;
    } crl;
  } data;
  int ok = 0;
  size_t i;
  int k;
  uint32_t h;
  uint32_t hash_array[2];
  int hash_index;
  char *b = NULL;
  X509_OBJECT stmp, *tmp;
  const char *postfix = "";

  if (name == NULL) {
    return 0;
  }

  stmp.type = type;
  BY_DIR *ctx = reinterpret_cast<BY_DIR *>(xl->method_data);
  if (type == X509_LU_X509) {
    data.x509.st_x509.cert_info = &data.x509.st_x509_cinf;
    data.x509.st_x509_cinf.subject = name;
    stmp.data.x509 = &data.x509.st_x509;
    postfix = "";
  } else if (type == X509_LU_CRL) {
    data.crl.st_crl.crl = &data.crl.st_crl_info;
    data.crl.st_crl_info.issuer = name;
    stmp.data.crl = &data.crl.st_crl;
    postfix = "r";
  } else {
    OPENSSL_PUT_ERROR(X509, X509_R_WRONG_LOOKUP_TYPE);
    goto finish;
  }

  hash_array[0] = X509_NAME_hash(name);
  hash_array[1] = X509_NAME_hash_old(name);
  for (hash_index = 0; hash_index < 2; ++hash_index) {
    h = hash_array[hash_index];
    for (i = 0; i < sk_BY_DIR_ENTRY_num(ctx->dirs); i++) {
      BY_DIR_ENTRY *ent;
      size_t idx;
      BY_DIR_HASH htmp, *hent;
      ent = sk_BY_DIR_ENTRY_value(ctx->dirs, i);
      if (type == X509_LU_CRL && ent->hashes) {
        htmp.hash = h;
        CRYPTO_MUTEX_lock_read(&ent->lock);
        if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
          hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          k = hent->suffix;
        } else {
          hent = NULL;
          k = 0;
        }
        CRYPTO_MUTEX_unlock_read(&ent->lock);
      } else {
        k = 0;
        hent = NULL;
      }
      for (;;) {
        OPENSSL_free(b);
        if (OPENSSL_asprintf(&b, "%s/%08" PRIx32 ".%s%d", ent->dir, h, postfix,
                             k) == -1) {
          OPENSSL_PUT_ERROR(X509, ERR_R_BUF_LIB);
          b = nullptr;
          goto finish;
        }
        if (type == X509_LU_X509) {
          if ((X509_load_cert_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CA".
            ERR_clear_error();
            break;
          }
        } else if (type == X509_LU_CRL) {
          if ((X509_load_crl_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CRL".
            ERR_clear_error();
            break;
          }
        }
        // The lack of a CA or CRL will be caught higher up
        k++;
      }

      // we have added it to the cache so now pull it out again
      CRYPTO_MUTEX_lock_write(&xl->store_ctx->objs_lock);
      tmp = NULL;
      sk_X509_OBJECT_sort(xl->store_ctx->objs);
      if (sk_X509_OBJECT_find(xl->store_ctx->objs, &idx, &stmp)) {
        tmp = sk_X509_OBJECT_value(xl->store_ctx->objs, idx);
      }
      CRYPTO_MUTEX_unlock_write(&xl->store_ctx->objs_lock);

      // If a CRL, update the last file suffix added for this

      if (type == X509_LU_CRL) {
        CRYPTO_MUTEX_lock_write(&ent->lock);
        // Look for entry again in case another thread added an entry
        // first.
        if (!hent) {
          htmp.hash = h;
          sk_BY_DIR_HASH_sort(ent->hashes);
          if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
            hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          }
        }
        if (!hent) {
          hent = reinterpret_cast<BY_DIR_HASH *>(
              OPENSSL_malloc(sizeof(BY_DIR_HASH)));
          if (hent == NULL) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            ok = 0;
            goto finish;
          }
          hent->hash = h;
          hent->suffix = k;
          if (!sk_BY_DIR_HASH_push(ent->hashes, hent)) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            OPENSSL_free(hent);
            ok = 0;
            goto finish;
          }
          sk_BY_DIR_HASH_sort(ent->hashes);
        } else if (hent->suffix < k) {
          hent->suffix = k;
        }

        CRYPTO_MUTEX_unlock_write(&ent->lock);
      }

      if (tmp != NULL) {
        ok = 1;
        ret->type = tmp->type;
        OPENSSL_memcpy(&ret->data, &tmp->data, sizeof(ret->data));

        // Clear any errors that might have been raised processing empty
        // or malformed files.
        ERR_clear_error();

        // If we were going to up the reference count, we would need
        // to do it on a perl 'type' basis
        goto finish;
      }
    }
  }
finish:
  OPENSSL_free(b);
  return ok;
}